

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O3

bool __thiscall ExecutorX86::Run(ExecutorX86 *this,uint functionID,char *arguments)

{
  RegVmRegister **ppRVar1;
  CodeGenRegVmStateContext *__env;
  ExternFuncInfo *function;
  uint uVar2;
  anon_union_8_3_3250f155_for_RegVmRegister_0 *paVar3;
  ExternFuncInfo *pEVar4;
  RegVmRegister RVar5;
  uchar *puVar6;
  uint *puVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  size_t sVar14;
  char *pcVar15;
  CodeGenRegVmCallStackEntry *pCVar16;
  RegVmRegister *pRVar17;
  byte bVar18;
  char *pcVar19;
  sigaction sigSEGV;
  sigaction sigTRAP;
  sigaction sigFPE;
  sigaction sa;
  jmp_buf prevErrorHandler;
  JmpBufData data;
  sigaction local_428;
  sigaction local_390;
  sigaction local_2f8;
  sigaction local_260;
  undefined1 local_1c8 [208];
  undefined1 local_f8 [200];
  
  if (this->exRegVmCode->count == 0) {
    this->codeRunning = false;
    this->callContinue = false;
    pcVar19 = this->execErrorBuffer;
    pcVar15 = "ERROR: module contains no code";
LAB_00247350:
    NULLC::SafeSprintf(pcVar19,0x10000,"%s",pcVar15);
    this->execErrorMessage = this->execErrorBuffer;
    (this->execErrorObject).typeID = 0;
    (this->execErrorObject).ptr = (char *)0x0;
    return false;
  }
  bVar18 = functionID != 0xffffffff & this->codeRunning;
  if ((bVar18 == 0) && (bVar8 = InitExecution(this), !bVar8)) {
    return false;
  }
  this->codeRunning = true;
  uVar2 = this->lastFinalReturn;
  this->lastFinalReturn =
       (uint)((ulong)((long)(this->vmState).callStackTop - (long)(this->vmState).callStackBase) >> 2
             );
  pcVar19 = (this->vmState).dataStackBase;
  uVar13 = (long)(this->vmState).dataStackTop - (long)pcVar19;
  if ((uVar13 & 0xf) != 0) {
    __assert_fail("prevDataSize % 16 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_X86.cpp"
                  ,0x35d,"bool ExecutorX86::Run(unsigned int, const char *)");
  }
  paVar3 = &((this->vmState).regFileLastTop)->field_0;
  if (functionID == 0xffffffff) {
    uVar12 = this->exLinker->globalVarSize;
    if ((uint)uVar13 < uVar12) {
      __assert_fail("unsigned(vmState.dataStackTop - vmState.dataStackBase) >= exLinker->globalVarSize"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_X86.cpp"
                    ,0x3c1,"bool ExecutorX86::Run(unsigned int, const char *)");
    }
    uVar9 = 0;
    NULLC::fillMemory(pcVar19,0,(ulong)uVar12);
    *paVar3 = (anon_union_8_3_3250f155_for_RegVmRegister_0)(this->vmState).dataStackBase;
    paVar3[1] = (anon_union_8_3_3250f155_for_RegVmRegister_0)(this->vmState).dataStackBase;
    paVar3[2] = (anon_union_8_3_3250f155_for_RegVmRegister_0)(this->exLinker->exRegVmConstants).data
    ;
    paVar3[3].longValue = (int64_t)paVar3;
    NULLC::fillMemory(paVar3 + 4,0,0x7e0);
    pRVar17 = (this->vmState).regFileLastPtr;
    (this->vmState).regFileLastPtr = (RegVmRegister *)paVar3;
    ppRVar1 = &(this->vmState).regFileLastTop;
    *ppRVar1 = *ppRVar1 + 0x100;
    uVar12 = 0;
LAB_002473fe:
    (this->vmState).jitCodeActive = true;
    if (bVar18 == 0) {
      local_260.__sigaction_handler.sa_handler = NULLC::HandleError;
      sigemptyset(&local_260.sa_mask);
      local_260.sa_flags = 0x10000004;
      sigaction(8,&local_260,&local_2f8);
      sigaction(5,&local_260,&local_390);
      sigaction(0xb,&local_260,&local_428);
    }
    NULLC::copyMemory(local_f8,NULLC::errorHandler,200);
    iVar10 = __sigsetjmp(NULLC::errorHandler,1);
    uVar11 = 5;
    if (iVar10 == 0) {
      if ((this->instAddress).count <= uVar12) {
        pcVar19 = 
        "T &FastVector<unsigned char *>::operator[](unsigned int) [T = unsigned char *, zeroNewMemory = false, skipConstructor = false]"
        ;
        goto LAB_00247912;
      }
      __env = &this->vmState;
      puVar6 = (this->instAddress).data[uVar12];
      NULLC::copyMemory(local_1c8,__env,200);
      iVar10 = _setjmp((__jmp_buf_tag *)__env);
      uVar11 = 5;
      if (iVar10 == 0) {
        uVar11 = (*(code *)this->codeLaunchHeader)(puVar6,paVar3);
      }
      NULLC::copyMemory(__env,local_1c8,200);
    }
    if (this->lastFinalReturn == 0) {
      sigaction(8,&local_2f8,(sigaction *)0x0);
      sigaction(5,&local_390,(sigaction *)0x0);
      sigaction(0xb,&local_428,(sigaction *)0x0);
    }
    NULLC::copyMemory(NULLC::errorHandler,local_f8,200);
    (this->vmState).jitCodeActive = false;
    (this->vmState).regFileLastPtr = pRVar17;
    if (functionID == 0xffffffff) {
      ppRVar1 = &(this->vmState).regFileLastTop;
      *ppRVar1 = *ppRVar1 + -0x100;
    }
    bVar18 = 0;
LAB_002476fc:
    (this->vmState).dataStackTop = (this->vmState).dataStackBase + (uVar13 & 0xffffffff);
    if (uVar11 == 5) {
LAB_0024772a:
      if (this->lastFinalReturn == 0) {
        pcVar19 = this->execErrorBuffer;
        sVar14 = strlen(pcVar19);
        pcVar19 = pcVar19 + sVar14;
        iVar10 = NULLC::SafeSprintf(pcVar19,(long)(0x10000 - (int)sVar14),"\r\nCall stack:\r\n");
        pCVar16 = (this->vmState).callStackBase;
        if ((int)((ulong)((long)(this->vmState).callStackTop - (long)pCVar16) >> 2) != 0) {
          pcVar19 = pcVar19 + iVar10;
          uVar13 = 0;
          do {
            if (pCVar16[uVar13].instruction == 0) break;
            uVar12 = PrintStackFrame(pCVar16[uVar13].instruction,pcVar19,
                                     (*(int *)&this->execErrorBuffer - (int)pcVar19) + 0x10000,false
                                    );
            pcVar19 = pcVar19 + uVar12;
            pCVar16 = (this->vmState).callStackBase;
            uVar13 = uVar13 + 1;
          } while (uVar13 < ((ulong)((long)(this->vmState).callStackTop - (long)pCVar16) >> 2 &
                            0xffffffff));
        }
      }
      this->execErrorFinalReturnDepth = this->lastFinalReturn;
      this->lastFinalReturn = uVar2;
      this->callContinue = false;
      this->codeRunning = false;
      return false;
    }
    if ((uVar9 != 0) && (uVar9 != uVar11)) {
      __assert_fail("retType == resultType && \"expected different result\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_X86.cpp"
                    ,0x43f,"bool ExecutorX86::Run(unsigned int, const char *)");
    }
    if (bVar18 != 0) goto LAB_0024772a;
    if (this->lastFinalReturn == 0) {
      this->codeRunning = false;
    }
    this->lastFinalReturn = uVar2;
    if (functionID == 0xffffffff) {
      (this->vmState).tempStackType = 0;
      if (uVar11 == 1) {
        (this->vmState).tempStackType = 7;
      }
      else if (uVar11 == 2) {
        (this->vmState).tempStackType = 5;
      }
      else if (uVar11 == 3) {
        (this->vmState).tempStackType = 4;
      }
      return true;
    }
    if (functionID < this->exFunctions->count) {
      uVar2 = this->exFunctions->data[functionID].funcType;
      if (uVar2 < this->exTypes->count) {
        uVar2 = this->exTypes->data[uVar2].field_11.subType;
        if (uVar2 < (this->exLinker->exTypeExtra).count) {
          (this->vmState).tempStackType = (this->exLinker->exTypeExtra).data[uVar2].type;
          return true;
        }
        pcVar19 = 
        "T &FastVector<ExternMemberInfo>::operator[](unsigned int) [T = ExternMemberInfo, zeroNewMemory = false, skipConstructor = false]"
        ;
      }
      else {
        pcVar19 = 
        "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
        ;
      }
      goto LAB_00247912;
    }
  }
  else if (functionID < this->exFunctions->count) {
    pEVar4 = this->exFunctions->data;
    function = pEVar4 + functionID;
    uVar12 = pEVar4[functionID].regVmAddress;
    uVar9 = GetFunctionVmReturnType(function,this->exTypes->data,(this->exLinker->exTypeExtra).data)
    ;
    if (uVar12 != 0xffffffff) {
      pcVar19 = (this->vmState).dataStackTop;
      iVar10 = *(int *)&(this->vmState).dataStackBase;
      if (((int)pcVar19 - iVar10) + function->argumentSize <
          (uint)(*(int *)&(this->vmState).dataStackEnd - iVar10)) {
        NULLC::copyMemory(pcVar19,arguments,(ulong)function->argumentSize);
        RVar5.field_0 = (anon_union_8_3_3250f155_for_RegVmRegister_0)(this->vmState).dataStackBase;
        iVar10 = RVar5.field_0.intValue;
        if ((*(int *)&(this->vmState).dataStackTop - iVar10) +
            (function->stackSize + 0xf & 0xfffffff0) <
            (uint)(*(int *)&(this->vmState).dataStackEnd - iVar10)) {
          *paVar3 = RVar5.field_0;
          paVar3[1].longValue = (int64_t)((this->vmState).dataStackBase + (uVar13 & 0xffffffff));
          paVar3[2] = (anon_union_8_3_3250f155_for_RegVmRegister_0)
                      (this->exLinker->exRegVmConstants).data;
          paVar3[3].longValue = (int64_t)paVar3;
          pRVar17 = (this->vmState).regFileLastPtr;
          (this->vmState).regFileLastPtr = (RegVmRegister *)paVar3;
          goto LAB_002473fe;
        }
      }
      pCVar16 = (this->vmState).callStackTop;
      pCVar16->instruction = uVar12 + 1;
      (this->vmState).callStackTop = pCVar16 + 1;
      this->codeRunning = false;
      this->callContinue = false;
      NULLC::SafeSprintf(this->execErrorBuffer,0x10000,"%s","ERROR: stack overflow");
      this->execErrorMessage = this->execErrorBuffer;
      (this->execErrorObject).typeID = 0;
      (this->execErrorObject).ptr = (char *)0x0;
      (this->vmState).dataStackTop = (this->vmState).dataStackBase + (uVar13 & 0xffffffff);
      goto LAB_0024772a;
    }
    if (function->retType == '\0') {
      this->codeRunning = false;
      this->callContinue = false;
      pcVar19 = this->execErrorBuffer;
      pcVar15 = "ERROR: can\'t call external function with complex return type";
      goto LAB_00247350;
    }
    NULLC::copyMemory((this->vmState).tempStackArrayBase,arguments,(ulong)function->argumentSize);
    uVar11 = uVar9;
    if (function->funcPtrWrap == (_func_void_void_ptr_char_ptr_char_ptr *)0x0) {
      this->codeRunning = false;
      this->callContinue = false;
      NULLC::SafeSprintf(this->execErrorBuffer,0x10000,"%s",
                         "ERROR: external raw function calls are disabled");
      this->execErrorMessage = this->execErrorBuffer;
      (this->execErrorObject).typeID = 0;
      (this->execErrorObject).ptr = (char *)0x0;
      bVar18 = 1;
    }
    else {
      puVar7 = (this->vmState).tempStackArrayBase;
      (*function->funcPtrWrap)(function->funcPtrWrapTarget,(char *)puVar7,(char *)puVar7);
      bVar18 = this->callContinue ^ 1;
    }
    goto LAB_002476fc;
  }
  pcVar19 = 
  "T &FastVector<ExternFuncInfo>::operator[](unsigned int) [T = ExternFuncInfo, zeroNewMemory = false, skipConstructor = false]"
  ;
LAB_00247912:
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x7f,pcVar19);
}

Assistant:

bool ExecutorX86::Run(unsigned int functionID, const char *arguments)
{
	if(exRegVmCode.empty())
	{
		Stop("ERROR: module contains no code");
		return false;
	}

	bool firstRun = !codeRunning || functionID == ~0u;

	if(firstRun)
	{
		if(!InitExecution())
			return false;
	}

	codeRunning = true;

	RegVmReturnType retType = rvrVoid;

	unsigned instructionPos = 0;

	bool errorState = false;

	// We will know that return is global if call stack size is equal to current
	unsigned prevLastFinalReturn = lastFinalReturn;
	lastFinalReturn = unsigned(vmState.callStackTop - vmState.callStackBase);

	unsigned prevDataSize = unsigned(vmState.dataStackTop - vmState.dataStackBase);

	assert(prevDataSize % 16 == 0);

	RegVmRegister *regFilePtr = vmState.regFileLastTop;

	if(functionID != ~0u)
	{
		ExternFuncInfo &target = exFunctions[functionID];

		unsigned funcPos = ~0u;
		funcPos = target.regVmAddress;

		retType = (RegVmReturnType)GetFunctionVmReturnType(target, exTypes.data, exLinker->exTypeExtra.data);

		if(funcPos == ~0u)
		{
			// Can't return complex types here
			if(target.retType == ExternFuncInfo::RETURN_UNKNOWN)
			{
				Stop("ERROR: can't call external function with complex return type");
				return false;
			}

			// Copy all arguments
			NULLC::copyMemory(vmState.tempStackArrayBase, arguments, target.argumentSize);

			// Call function
			if(target.funcPtrWrap)
			{
				target.funcPtrWrap(target.funcPtrWrapTarget, (char*)vmState.tempStackArrayBase, (char*)vmState.tempStackArrayBase);

				if(!callContinue)
					errorState = true;
			}
			else
			{
#if !defined(NULLC_NO_RAW_EXTERNAL_CALL)
				RunRawExternalFunction(dcCallVM, exFunctions[functionID], exLinker->exLocals.data, exTypes.data, exLinker->exTypeExtra.data, vmState.tempStackArrayBase, vmState.tempStackArrayBase);

				if(!callContinue)
					errorState = true;
#else
				Stop("ERROR: external raw function calls are disabled");

				errorState = true;
#endif
			}

			// This will disable NULLC code execution while leaving error check and result retrieval
			instructionPos = ~0u;
		}
		else
		{
			instructionPos = funcPos;

			unsigned argumentsSize = target.argumentSize;

			if(unsigned(vmState.dataStackTop - vmState.dataStackBase) + argumentsSize >= unsigned(vmState.dataStackEnd - vmState.dataStackBase))
			{
				CodeGenRegVmCallStackEntry *entry = vmState.callStackTop;

				entry->instruction = instructionPos + 1;

				vmState.callStackTop++;

				instructionPos = ~0u;
				Stop("ERROR: stack overflow");
				retType = rvrError;
			}
			else
			{
				// Copy arguments to new stack frame
				NULLC::copyMemory(vmState.dataStackTop, arguments, argumentsSize);

				unsigned stackSize = (target.stackSize + 0xf) & ~0xf;

				if(unsigned(vmState.dataStackTop - vmState.dataStackBase) + stackSize >= unsigned(vmState.dataStackEnd - vmState.dataStackBase))
				{
					CodeGenRegVmCallStackEntry *entry = vmState.callStackTop;

					entry->instruction = instructionPos + 1;

					vmState.callStackTop++;

					instructionPos = ~0u;
					Stop("ERROR: stack overflow");
					retType = rvrError;
				}
				else
				{
					regFilePtr[rvrrGlobals].ptrValue = uintptr_t(vmState.dataStackBase);
					regFilePtr[rvrrFrame].ptrValue = uintptr_t(vmState.dataStackBase + prevDataSize);
					regFilePtr[rvrrConstants].ptrValue = uintptr_t(exLinker->exRegVmConstants.data);
					regFilePtr[rvrrRegisters].ptrValue = uintptr_t(regFilePtr);
				}
			}
		}
	}
	else
	{
		// If global code is executed, reset all global variables
		assert(unsigned(vmState.dataStackTop - vmState.dataStackBase) >= exLinker->globalVarSize);
		NULLC::fillMemory(vmState.dataStackBase, 0, exLinker->globalVarSize);

		regFilePtr[rvrrGlobals].ptrValue = uintptr_t(vmState.dataStackBase);
		regFilePtr[rvrrFrame].ptrValue = uintptr_t(vmState.dataStackBase);
		regFilePtr[rvrrConstants].ptrValue = uintptr_t(exLinker->exRegVmConstants.data);
		regFilePtr[rvrrRegisters].ptrValue = uintptr_t(regFilePtr);

		NULLC::fillMemory(regFilePtr + rvrrCount, 0, (256 - rvrrCount) * sizeof(regFilePtr[0]));
	}

	RegVmRegister *prevRegFilePtr = vmState.regFileLastPtr;

	vmState.regFileLastPtr = regFilePtr;

	if(functionID == ~0u)
		vmState.regFileLastTop += 256;

	RegVmReturnType resultType = retType;

	if(instructionPos != ~0u)
	{
		vmState.jitCodeActive = true;

#ifdef __linux
		struct sigaction sa;
		struct sigaction sigFPE;
		struct sigaction sigTRAP;
		struct sigaction sigSEGV;

		if(firstRun)
		{
			sa.sa_sigaction = NULLC::HandleError;
			sigemptyset(&sa.sa_mask);
			sa.sa_flags = SA_RESTART | SA_SIGINFO;

			sigaction(SIGFPE, &sa, &sigFPE);
			sigaction(SIGTRAP, &sa, &sigTRAP);
			sigaction(SIGSEGV, &sa, &sigSEGV);
		}

		int errorCode = 0;

		NULLC::JmpBufData data;
		NULLC::copyMemory(data.data, NULLC::errorHandler, sizeof(sigjmp_buf));

		if(!(errorCode = sigsetjmp(NULLC::errorHandler, 1)))
		{
			unsigned char *codeStart = instAddress[instructionPos];

			jmp_buf prevErrorHandler;
			NULLC::copyMemory(&prevErrorHandler, &vmState.errorHandler, sizeof(jmp_buf));

			if(!setjmp(vmState.errorHandler))
			{
				typedef	uintptr_t(*nullcFunc)(unsigned char *codeStart, RegVmRegister *regFilePtr);
				nullcFunc gate = (nullcFunc)(uintptr_t)codeLaunchHeader;
				resultType = (RegVmReturnType)gate(codeStart, regFilePtr);
			}
			else
			{
				resultType = rvrError;
			}

			NULLC::copyMemory(&vmState.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
		}
		else
		{
			resultType = rvrError;
		}

		// Disable signal handlers only from top-level Run
		if(lastFinalReturn == 0)
		{
			sigaction(SIGFPE, &sigFPE, NULL);
			sigaction(SIGTRAP, &sigTRAP, NULL);
			sigaction(SIGSEGV, &sigSEGV, NULL);
		}

		NULLC::copyMemory(NULLC::errorHandler, data.data, sizeof(sigjmp_buf));
#else
		__try
		{
			unsigned char *codeStart = instAddress[instructionPos];

			jmp_buf prevErrorHandler;
			NULLC::copyMemory(&prevErrorHandler, &vmState.errorHandler, sizeof(jmp_buf));

			if(!setjmp(vmState.errorHandler))
			{
				typedef	uintptr_t(*nullcFunc)(unsigned char *codeStart, RegVmRegister *regFilePtr);
				nullcFunc gate = (nullcFunc)(uintptr_t)codeLaunchHeader;
				resultType = (RegVmReturnType)gate(codeStart, regFilePtr);
			}
			else
			{
				resultType = rvrError;
			}

			NULLC::copyMemory(&vmState.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
		}
		__except(NULLC::CanWeHandleSEH(GetExceptionCode(), GetExceptionInformation()))
		{
			resultType = rvrError;
		}
#endif

		vmState.jitCodeActive = false;
	}

	vmState.regFileLastPtr = prevRegFilePtr;

	if(functionID == ~0u)
		vmState.regFileLastTop -= 256;

	vmState.dataStackTop = vmState.dataStackBase + prevDataSize;

	if(resultType == rvrError)
	{
		errorState = true;
	}
	else
	{
		if(retType == rvrVoid)
			retType = resultType;
		else
			assert(retType == resultType && "expected different result");
	}

	// If there was an execution error
	if(errorState)
	{
		// Print call stack on error, when we get to the first function
		if(lastFinalReturn == 0)
		{
			char *currPos = execErrorBuffer + strlen(execErrorBuffer);
			currPos += NULLC::SafeSprintf(currPos, NULLC_ERROR_BUFFER_SIZE - int(currPos - execErrorBuffer), "\r\nCall stack:\r\n");

			unsigned currentFrame = 0;
			while(unsigned address = GetCallStackAddress(currentFrame++))
				currPos += PrintStackFrame(address, currPos, NULLC_ERROR_BUFFER_SIZE - int(currPos - execErrorBuffer), false);
		}

		execErrorFinalReturnDepth = lastFinalReturn;
		lastFinalReturn = prevLastFinalReturn;

		// Ascertain that execution stops when there is a chain of nullcRunFunction
		callContinue = false;
		codeRunning = false;

		return false;
	}

	if(lastFinalReturn == 0)
		codeRunning = false;

	lastFinalReturn = prevLastFinalReturn;

	if(functionID != ~0u)
	{
		ExternFuncInfo &target = exFunctions[functionID];
		ExternTypeInfo &targetType = exTypes[target.funcType];

		vmState.tempStackType = exLinker->exTypeExtra[targetType.memberOffset].type;
	}
	else
	{
		vmState.tempStackType = NULLC_TYPE_VOID;

		switch(retType)
		{
		case rvrInt:
			vmState.tempStackType = NULLC_TYPE_INT;
			break;
		case rvrDouble:
			vmState.tempStackType = NULLC_TYPE_DOUBLE;
			break;
		case rvrLong:
			vmState.tempStackType = NULLC_TYPE_LONG;
			break;
		default:
			break;
		}
	}

	return true;
}